

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O0

void __thiscall
icu_63::DataBuilderCollationIterator::DataBuilderCollationIterator
          (DataBuilderCollationIterator *this,CollationDataBuilder *b)

{
  UChar32 index;
  uint32_t uVar1;
  int local_28;
  UChar32 jamo;
  int32_t j;
  CollationDataBuilder *b_local;
  DataBuilderCollationIterator *this_local;
  
  (this->super_CollationIterator).super_UObject._vptr_UObject =
       (_func_int **)&PTR__DataBuilderCollationIterator_0049d6a8;
  CollationIterator::CollationIterator(&this->super_CollationIterator,&this->builderData,'\0');
  (this->super_CollationIterator).super_UObject._vptr_UObject =
       (_func_int **)&PTR__DataBuilderCollationIterator_0049d6a8;
  this->builder = b;
  CollationData::CollationData(&this->builderData,b->nfcImpl);
  this->s = (UnicodeString *)0x0;
  this->pos = 0;
  (this->builderData).base = this->builder->base;
  for (local_28 = 0; local_28 < 0x43; local_28 = local_28 + 1) {
    index = CollationDataBuilder::jamoCpFromIndex(local_28);
    uVar1 = Collation::makeCE32FromTagAndIndex(7,index);
    this->jamoCE32s[local_28] = uVar1 | 0x100;
  }
  (this->builderData).jamoCE32s = this->jamoCE32s;
  return;
}

Assistant:

DataBuilderCollationIterator::DataBuilderCollationIterator(CollationDataBuilder &b)
        : CollationIterator(&builderData, /*numeric=*/ FALSE),
          builder(b), builderData(b.nfcImpl),
          s(NULL), pos(0) {
    builderData.base = builder.base;
    // Set all of the jamoCE32s[] to indirection CE32s.
    for(int32_t j = 0; j < CollationData::JAMO_CE32S_LENGTH; ++j) {  // Count across Jamo types.
        UChar32 jamo = CollationDataBuilder::jamoCpFromIndex(j);
        jamoCE32s[j] = Collation::makeCE32FromTagAndIndex(Collation::BUILDER_DATA_TAG, jamo) |
                CollationDataBuilder::IS_BUILDER_JAMO_CE32;
    }
    builderData.jamoCE32s = jamoCE32s;
}